

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void set_cpu_mapping(uint32_t id,cpu_mapping *mapping)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar2 = preallocated_cpu_mappings;
  if (max_id == 0xffffffff || max_id < id) {
    max_id = id;
  }
  uVar3 = (ulong)preallocated_cpu_mappings;
  if (preallocated_cpu_mappings <= id) {
    if ((uVar3 == 0) && (preallocated_cpu_mappings = 4, 4 < id)) {
      preallocated_cpu_mappings = id;
    }
    uVar1 = preallocated_cpu_mappings * 2;
    preallocated_cpu_mappings = uVar1;
    cpu_mappings = (cpu_mapping **)realloc(cpu_mappings,(ulong)uVar1 * 8);
    memset(cpu_mappings + uVar3,0,(ulong)(uVar1 - uVar2) << 3);
  }
  cpu_mappings[id] = mapping;
  return;
}

Assistant:

void set_cpu_mapping(uint32_t id, struct cpu_mapping *mapping)
{
	if (max_id == UINT32_MAX || id > max_id)
		max_id = id;

	if (id >= preallocated_cpu_mappings)
	{
		uint32_t preallocated = preallocated_cpu_mappings;
		if (preallocated_cpu_mappings == 0)
		{
			if (id > 4)
				preallocated_cpu_mappings = id;
			else
				preallocated_cpu_mappings = 4;
		}
		preallocated_cpu_mappings *= 2;

		cpu_mappings = realloc(cpu_mappings,
				sizeof(void *) * preallocated_cpu_mappings);
		memset(&cpu_mappings[preallocated], 0,
				sizeof(void *) * (preallocated_cpu_mappings - preallocated));
	}

	cpu_mappings[id] = mapping;
}